

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void sbox_aux_s128_lowmc_255_255_4(mzd_local_t *statein,mzd_local_t *stateout,randomTape_t *tapes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar25;
  long in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  bitstream_t aux_tape;
  bitstream_t last_party_tape;
  bitstream_t parity_tape;
  __m128i carry_7;
  __m128i total_carry_7;
  __m128i carry_6;
  __m128i total_carry_6;
  __m128i carry_5;
  __m128i total_carry_5;
  __m128i carry_4;
  __m128i total_carry_4;
  word128 t2 [2];
  word128 t1 [2];
  word128 t0 [2];
  word128 fresh_output_ca [2];
  word128 fresh_output_bc [2];
  word128 fresh_output_ab [2];
  __m128i carry_3;
  __m128i total_carry_3;
  __m128i carry_2;
  __m128i total_carry_2;
  word128 f [2];
  word128 e [2];
  word128 d [2];
  __m128i carry_1;
  __m128i total_carry_1;
  __m128i carry;
  __m128i total_carry;
  word128 c [2];
  word128 b [2];
  word128 a [2];
  word128 aux [2];
  word128 bitc [2];
  word128 bitb [2];
  word128 bita [2];
  undefined1 auVar26 [16];
  bitstream_t *bs;
  undefined1 auVar27 [16];
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [32];
  undefined1 local_11a8 [32];
  ulong local_1188;
  ulong uStack_1180;
  ulong local_1178;
  ulong uStack_1170;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  word local_1008;
  word wStack_1000;
  word local_ff8;
  word wStack_ff0;
  word local_fe8;
  word wStack_fe0;
  word local_fd8;
  word wStack_fd0;
  word local_fc8;
  word wStack_fc0;
  word local_fb8;
  word wStack_fb0;
  long local_fa0;
  undefined1 (*local_f88) [16];
  undefined1 (*local_f78) [16];
  undefined8 local_f68;
  mzd_local_t *local_f60;
  undefined8 local_f58;
  mzd_local_t *local_f50;
  undefined8 local_f48;
  mzd_local_t *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  undefined1 *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  undefined1 *local_f00;
  undefined1 *local_ef8;
  ulong *local_ef0;
  word *local_ee8;
  undefined1 *local_ee0;
  ulong *local_ed8;
  word *local_ed0;
  undefined1 *local_ec8;
  ulong *local_ec0;
  word *local_eb8;
  undefined1 *local_eb0;
  ulong *local_ea8;
  word *local_ea0;
  undefined1 *local_e98;
  ulong *local_e90;
  word *local_e88;
  undefined1 *local_e80;
  ulong *local_e78;
  word *local_e70;
  undefined1 *local_e68;
  undefined4 local_e5c;
  ulong local_e58;
  ulong uStack_e50;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined4 local_e1c;
  ulong local_e18;
  ulong uStack_e10;
  undefined4 local_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined4 local_ddc;
  ulong local_dd8;
  ulong uStack_dd0;
  undefined4 local_dbc;
  ulong local_db8;
  ulong uStack_db0;
  undefined4 local_d9c;
  ulong local_d98;
  ulong uStack_d90;
  undefined4 local_d7c;
  ulong local_d78;
  ulong uStack_d70;
  undefined4 local_d5c;
  undefined1 local_d58 [16];
  undefined4 local_d3c;
  undefined1 local_d38 [16];
  undefined4 local_d1c;
  undefined1 local_d18 [16];
  undefined4 local_cfc;
  undefined1 local_cf8 [16];
  undefined4 local_cdc;
  undefined1 local_cd8 [16];
  undefined4 local_cbc;
  undefined1 local_cb8 [16];
  undefined4 local_c9c;
  undefined1 local_c98 [16];
  undefined4 local_c7c;
  undefined1 local_c78 [16];
  undefined4 local_c5c;
  undefined1 local_c58 [16];
  undefined4 local_c3c;
  undefined1 local_c38 [16];
  undefined4 local_c1c;
  undefined1 local_c18 [16];
  undefined4 local_bfc;
  undefined1 local_bf8 [16];
  word128 *local_be8;
  bitstream_t *pbStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  size_t local_bc8;
  size_t sStack_bc0;
  undefined1 local_bb8 [16];
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined1 local_b58 [16];
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined1 local_b38 [16];
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [16];
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined1 local_ad8 [16];
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined1 local_a78 [16];
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined1 local_a38 [16];
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined1 local_a18 [16];
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined1 local_9d8 [16];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined1 local_9b8 [16];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined1 local_978 [16];
  undefined8 local_968;
  undefined8 uStack_960;
  undefined1 local_958 [16];
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  undefined8 local_908;
  undefined8 uStack_900;
  undefined1 local_8f8 [16];
  undefined4 local_8dc;
  undefined1 local_8d8 [16];
  undefined4 local_8bc;
  undefined1 local_8b8 [16];
  undefined4 local_89c;
  undefined1 local_898 [16];
  undefined4 local_87c;
  undefined1 local_878 [16];
  undefined4 local_85c;
  undefined1 local_858 [16];
  undefined4 local_83c;
  undefined1 local_838 [16];
  undefined4 local_81c;
  undefined1 local_818 [16];
  undefined4 local_7fc;
  undefined1 local_7f8 [16];
  undefined4 local_7dc;
  undefined1 local_7d8 [16];
  undefined4 local_7bc;
  undefined1 local_7b8 [16];
  undefined4 local_79c;
  undefined1 local_798 [16];
  undefined4 local_77c;
  undefined1 local_778 [16];
  undefined4 local_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined4 local_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined4 local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined4 local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_69c;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined1 *local_668;
  ulong *local_660;
  ulong *local_658;
  undefined1 *local_650;
  ulong *local_648;
  ulong *local_640;
  undefined1 *local_638;
  ulong *local_630;
  ulong *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  ulong *local_5f0;
  undefined1 *local_5e8;
  ulong *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  ulong *local_5b8;
  ulong *local_5b0;
  undefined1 *local_5a8;
  ulong *local_5a0;
  ulong *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  ulong *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  ulong *local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  word local_518;
  word wStack_510;
  word local_4f8;
  word wStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  word local_4d8;
  word wStack_4d0;
  word local_4b8;
  word wStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  word local_498;
  word wStack_490;
  word local_478;
  word wStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  word local_458;
  word wStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  word local_438;
  word wStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  word local_418;
  word wStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  word local_3f8;
  word wStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  word local_3d8;
  word wStack_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_f40 = mask_255_255_85_a;
  local_fc8 = 0x2492492492492492;
  wStack_fc0 = 0x9249249249249249;
  local_f48 = 0x1980d0;
  local_f50 = mask_255_255_85_b;
  local_fe8 = 0x4924924924924924;
  wStack_fe0 = 0x2492492492492492;
  local_f58 = 0x1980f0;
  local_fd8 = 0x9249249249249249;
  wStack_fd0 = 0x4924924924924924;
  local_f60 = mask_255_255_85_c;
  local_1008 = 0x9249249249249248;
  wStack_1000 = 0x4924924924924924;
  local_f68 = 0x198110;
  local_ff8 = 0x2492492492492492;
  wStack_ff0 = 0x9249249249249249;
  local_528 = *(undefined8 *)*in_RDI;
  uStack_520 = *(undefined8 *)(*in_RDI + 8);
  local_f78 = in_RDI + 1;
  local_e68 = local_1048;
  local_e70 = &local_fc8;
  local_e78 = &local_1028;
  local_518 = 0x2492492492492492;
  wStack_510 = 0x9249249249249249;
  auVar13._8_8_ = 0x9249249249249249;
  auVar13._0_8_ = 0x2492492492492492;
  auVar1 = vpand_avx(auVar13,*in_RDI);
  auVar23._8_8_ = wStack_fb0;
  auVar23._0_8_ = local_fb8;
  auVar15._8_8_ = uStack_1010;
  auVar15._0_8_ = local_1018;
  auVar2 = vpand_avx(auVar23,auVar15);
  local_e80 = local_1068;
  local_e88 = &local_fe8;
  local_e90 = &local_1028;
  local_4d8 = 0x4924924924924924;
  wStack_4d0 = 0x2492492492492492;
  auVar11._8_8_ = 0x2492492492492492;
  auVar11._0_8_ = 0x4924924924924924;
  auVar27 = vpand_avx(auVar11,*in_RDI);
  local_4f8 = 0x9249249249249249;
  wStack_4f0 = 0x4924924924924924;
  auVar21._8_8_ = 0x4924924924924924;
  auVar21._0_8_ = 0x9249249249249249;
  auVar16._8_8_ = uStack_1010;
  auVar16._0_8_ = local_1018;
  auVar3 = vpand_avx(auVar21,auVar16);
  local_e98 = local_1088;
  local_ea0 = &local_1008;
  local_ea8 = &local_1028;
  local_498 = 0x9249249249249248;
  wStack_490 = 0x4924924924924924;
  auVar9._8_8_ = 0x4924924924924924;
  auVar9._0_8_ = 0x9249249249249248;
  local_1088 = vpand_avx(auVar9,*in_RDI);
  local_4b8 = 0x2492492492492492;
  wStack_4b0 = 0x9249249249249249;
  auVar19._8_8_ = 0x9249249249249249;
  auVar19._0_8_ = 0x2492492492492492;
  auVar17._8_8_ = uStack_1010;
  auVar17._0_8_ = local_1018;
  local_1078 = vpand_avx(auVar19,auVar17);
  local_bf8 = vpsrldq_avx(auVar1,8);
  local_bfc = 0x3e;
  local_1098 = vpsrlq_avx(local_bf8,ZEXT416(0x3e));
  local_c18 = vpslldq_avx(auVar1,8);
  local_c1c = 0x3e;
  auVar26 = vpsrlq_avx(local_c18,ZEXT416(0x3e));
  local_1048._0_8_ = auVar1._0_8_;
  local_1048._8_8_ = auVar1._8_8_;
  local_678 = local_1048._0_8_;
  uStack_670 = local_1048._8_8_;
  local_67c = 2;
  local_8f8 = vpsllq_avx(auVar1,ZEXT416(2));
  local_10a8._0_8_ = auVar26._0_8_;
  local_10a8._8_8_ = auVar26._8_8_;
  local_908 = local_10a8._0_8_;
  uStack_900 = local_10a8._8_8_;
  local_1048 = vpor_avx(local_8f8,auVar26);
  local_c38 = vpslldq_avx(auVar2,8);
  local_c3c = 0x3e;
  local_10a8 = vpsrlq_avx(local_c38,ZEXT416(0x3e));
  local_1038._0_8_ = auVar2._0_8_;
  local_1038._8_8_ = auVar2._8_8_;
  local_698 = local_1038._0_8_;
  uStack_690 = local_1038._8_8_;
  local_69c = 2;
  local_918 = vpsllq_avx(auVar2,ZEXT416(2));
  local_928 = local_10a8._0_8_;
  uStack_920 = local_10a8._8_8_;
  auVar1 = vpor_avx(local_918,local_10a8);
  local_1038._0_8_ = auVar1._0_8_;
  local_1038._8_8_ = auVar1._8_8_;
  local_938 = local_1038._0_8_;
  uStack_930 = local_1038._8_8_;
  local_948 = local_1098._0_8_;
  uStack_940 = local_1098._8_8_;
  local_1038 = vpor_avx(auVar1,local_1098);
  local_c58 = vpsrldq_avx(auVar27,8);
  local_c5c = 0x3f;
  local_10b8 = vpsrlq_avx(local_c58,ZEXT416(0x3f));
  local_c78 = vpslldq_avx(auVar27,8);
  local_c7c = 0x3f;
  auVar1 = vpsrlq_avx(local_c78,ZEXT416(0x3f));
  local_1068._0_8_ = auVar27._0_8_;
  local_1068._8_8_ = auVar27._8_8_;
  local_6b8 = local_1068._0_8_;
  uStack_6b0 = local_1068._8_8_;
  local_6bc = 1;
  local_958 = vpsllq_avx(auVar27,ZEXT416(1));
  local_10c8._0_8_ = auVar1._0_8_;
  local_10c8._8_8_ = auVar1._8_8_;
  local_968 = local_10c8._0_8_;
  uStack_960 = local_10c8._8_8_;
  local_1068 = vpor_avx(local_958,auVar1);
  local_c98 = vpslldq_avx(auVar3,8);
  local_c9c = 0x3f;
  local_10c8 = vpsrlq_avx(local_c98,ZEXT416(0x3f));
  local_1058._0_8_ = auVar3._0_8_;
  local_1058._8_8_ = auVar3._8_8_;
  local_6d8 = local_1058._0_8_;
  uStack_6d0 = local_1058._8_8_;
  local_6dc = 1;
  local_978 = vpsllq_avx(auVar3,ZEXT416(1));
  local_988 = local_10c8._0_8_;
  uStack_980 = local_10c8._8_8_;
  auVar1 = vpor_avx(local_978,local_10c8);
  local_1058._0_8_ = auVar1._0_8_;
  local_1058._8_8_ = auVar1._8_8_;
  local_998 = local_1058._0_8_;
  uStack_990 = local_1058._8_8_;
  local_9a8 = local_10b8._0_8_;
  uStack_9a0 = local_10b8._8_8_;
  local_1058 = vpor_avx(auVar1,local_10b8);
  local_468 = *(undefined8 *)*in_RSI;
  uStack_460 = *(undefined8 *)(*in_RSI + 8);
  local_f88 = in_RSI + 1;
  local_448 = *(undefined8 *)*local_f88;
  uStack_440 = *(undefined8 *)(in_RSI[1] + 8);
  local_eb0 = local_10e8;
  local_eb8 = &local_fc8;
  local_ec0 = &local_1028;
  local_458 = 0x2492492492492492;
  wStack_450 = 0x9249249249249249;
  auVar14._8_8_ = 0x9249249249249249;
  auVar14._0_8_ = 0x2492492492492492;
  auVar1 = vpand_avx(auVar14,*in_RSI);
  local_478 = 0x4924924924924924;
  wStack_470 = 0x2492492492492492;
  auVar24._8_8_ = 0x2492492492492492;
  auVar24._0_8_ = 0x4924924924924924;
  auVar18._8_8_ = uStack_1010;
  auVar18._0_8_ = local_1018;
  auVar2 = vpand_avx(auVar24,auVar18);
  local_ec8 = local_1108;
  local_ed0 = &local_fe8;
  local_ed8 = &local_1028;
  local_418 = 0x4924924924924924;
  wStack_410 = 0x2492492492492492;
  auVar12._8_8_ = 0x2492492492492492;
  auVar12._0_8_ = 0x4924924924924924;
  auVar27 = vpand_avx(auVar12,*in_RSI);
  local_438 = 0x9249249249249249;
  wStack_430 = 0x4924924924924924;
  auVar22._8_8_ = 0x4924924924924924;
  auVar22._0_8_ = 0x9249249249249249;
  auVar3 = vpand_avx(auVar22,*local_f88);
  local_ee0 = local_1128;
  local_ee8 = &local_1008;
  local_ef0 = &local_1028;
  local_3d8 = 0x9249249249249248;
  wStack_3d0 = 0x4924924924924924;
  auVar10._8_8_ = 0x4924924924924924;
  auVar10._0_8_ = 0x9249249249249248;
  local_1128 = vpand_avx(auVar10,*in_RSI);
  local_3f8 = 0x2492492492492492;
  wStack_3f0 = 0x9249249249249249;
  auVar20._8_8_ = 0x9249249249249249;
  auVar20._0_8_ = 0x2492492492492492;
  local_1118 = vpand_avx(auVar20,*local_f88);
  local_cb8 = vpsrldq_avx(auVar1,8);
  local_cbc = 0x3e;
  local_1138 = vpsrlq_avx(local_cb8,ZEXT416(0x3e));
  local_cd8 = vpslldq_avx(auVar1,8);
  local_cdc = 0x3e;
  auVar26 = vpsrlq_avx(local_cd8,ZEXT416(0x3e));
  local_10e8._0_8_ = auVar1._0_8_;
  local_10e8._8_8_ = auVar1._8_8_;
  local_6f8 = local_10e8._0_8_;
  uStack_6f0 = local_10e8._8_8_;
  local_6fc = 2;
  local_9b8 = vpsllq_avx(auVar1,ZEXT416(2));
  local_1148._0_8_ = auVar26._0_8_;
  local_1148._8_8_ = auVar26._8_8_;
  local_9c8 = local_1148._0_8_;
  uStack_9c0 = local_1148._8_8_;
  local_10e8 = vpor_avx(local_9b8,auVar26);
  local_cf8 = vpslldq_avx(auVar2,8);
  local_cfc = 0x3e;
  local_1148 = vpsrlq_avx(local_cf8,ZEXT416(0x3e));
  local_10d8._0_8_ = auVar2._0_8_;
  local_10d8._8_8_ = auVar2._8_8_;
  local_718 = local_10d8._0_8_;
  uStack_710 = local_10d8._8_8_;
  local_71c = 2;
  local_9d8 = vpsllq_avx(auVar2,ZEXT416(2));
  local_9e8 = local_1148._0_8_;
  uStack_9e0 = local_1148._8_8_;
  auVar1 = vpor_avx(local_9d8,local_1148);
  local_10d8._0_8_ = auVar1._0_8_;
  local_10d8._8_8_ = auVar1._8_8_;
  local_9f8 = local_10d8._0_8_;
  uStack_9f0 = local_10d8._8_8_;
  local_a08 = local_1138._0_8_;
  uStack_a00 = local_1138._8_8_;
  local_10d8 = vpor_avx(auVar1,local_1138);
  local_d18 = vpsrldq_avx(auVar27,8);
  local_d1c = 0x3f;
  local_1158 = vpsrlq_avx(local_d18,ZEXT416(0x3f));
  local_d38 = vpslldq_avx(auVar27,8);
  local_d3c = 0x3f;
  auVar1 = vpsrlq_avx(local_d38,ZEXT416(0x3f));
  local_1108._0_8_ = auVar27._0_8_;
  local_1108._8_8_ = auVar27._8_8_;
  local_738 = local_1108._0_8_;
  uStack_730 = local_1108._8_8_;
  local_73c = 1;
  local_a18 = vpsllq_avx(auVar27,ZEXT416(1));
  local_1168._0_8_ = auVar1._0_8_;
  local_1168._8_8_ = auVar1._8_8_;
  local_a28 = local_1168._0_8_;
  uStack_a20 = local_1168._8_8_;
  local_1108 = vpor_avx(local_a18,auVar1);
  local_d58 = vpslldq_avx(auVar3,8);
  local_d5c = 0x3f;
  local_1168 = vpsrlq_avx(local_d58,ZEXT416(0x3f));
  local_10f8._0_8_ = auVar3._0_8_;
  local_10f8._8_8_ = auVar3._8_8_;
  local_758 = local_10f8._0_8_;
  uStack_750 = local_10f8._8_8_;
  local_75c = 1;
  local_a38 = vpsllq_avx(auVar3,ZEXT416(1));
  local_a48 = local_1168._0_8_;
  uStack_a40 = local_1168._8_8_;
  auVar1 = vpor_avx(local_a38,local_1168);
  local_10f8._0_8_ = auVar1._0_8_;
  local_10f8._8_8_ = auVar1._8_8_;
  local_a58 = local_10f8._0_8_;
  uStack_a50 = local_10f8._8_8_;
  local_a68 = local_1158._0_8_;
  uStack_a60 = local_1158._8_8_;
  local_10f8 = vpor_avx(auVar1,local_1158);
  local_550 = &local_1188;
  local_558 = local_1048;
  local_560 = local_1068;
  local_2d8 = local_1048._0_8_;
  uStack_2d0 = local_1048._8_8_;
  local_2e8 = local_1068._0_8_;
  uStack_2e0 = local_1068._8_8_;
  local_2a8 = local_1048._0_8_ ^ local_1068._0_8_;
  uStack_2a0 = local_1048._8_8_ ^ local_1068._8_8_;
  local_2f8 = local_1038._0_8_;
  uStack_2f0 = local_1038._8_8_;
  local_308 = local_1058._0_8_;
  uStack_300 = local_1058._8_8_;
  local_2c8 = local_1038._0_8_ ^ local_1058._0_8_;
  uStack_2c0 = local_1038._8_8_ ^ local_1058._8_8_;
  local_568 = local_11c8;
  local_570 = local_1108;
  local_578 = &local_1188;
  local_298 = local_1108._0_8_;
  uStack_290 = local_1108._8_8_;
  local_d78 = local_1108._0_8_ ^ local_2a8;
  uStack_d70 = local_1108._8_8_ ^ uStack_2a0;
  local_2b8 = local_10f8._0_8_;
  uStack_2b0 = local_10f8._8_8_;
  local_d98 = local_10f8._0_8_ ^ local_2c8;
  uStack_d90 = local_10f8._8_8_ ^ uStack_2c0;
  local_580 = local_11a8;
  local_588 = local_10e8;
  local_590 = local_1048;
  local_258 = local_10e8._0_8_;
  uStack_250 = local_10e8._8_8_;
  local_268 = local_1048._0_8_;
  uStack_260 = local_1048._8_8_;
  local_db8 = local_10e8._0_8_ ^ local_1048._0_8_;
  uStack_db0 = local_10e8._8_8_ ^ local_1048._8_8_;
  local_278 = local_10d8._0_8_;
  uStack_270 = local_10d8._8_8_;
  local_288 = local_1038._0_8_;
  uStack_280 = local_1038._8_8_;
  local_dd8 = local_10d8._0_8_ ^ local_1038._0_8_;
  uStack_dd0 = local_10d8._8_8_ ^ local_1038._8_8_;
  local_598 = &local_1188;
  local_5a0 = &local_1188;
  local_5a8 = local_1088;
  local_228 = local_1088._0_8_;
  uStack_220 = local_1088._8_8_;
  local_1d8 = local_2a8 ^ local_1088._0_8_;
  uStack_1d0 = uStack_2a0 ^ local_1088._8_8_;
  local_248 = local_1078._0_8_;
  uStack_240 = local_1078._8_8_;
  local_1f8 = local_2c8 ^ local_1078._0_8_;
  uStack_1f0 = uStack_2c0 ^ local_1078._8_8_;
  local_5b0 = &local_1188;
  local_5b8 = &local_1188;
  local_5c0 = local_1128;
  local_1e8 = local_1128._0_8_;
  uStack_1e0 = local_1128._8_8_;
  local_168 = local_1d8 ^ local_1128._0_8_;
  uStack_160 = uStack_1d0 ^ local_1128._8_8_;
  local_208 = local_1118._0_8_;
  uStack_200 = local_1118._8_8_;
  local_188 = local_1f8 ^ local_1118._0_8_;
  uStack_180 = uStack_1f0 ^ local_1118._8_8_;
  auVar2._8_8_ = uStack_d90;
  auVar2._0_8_ = local_d98;
  local_778 = vpslldq_avx(auVar2,8);
  local_77c = 0x3e;
  auVar2 = vpsllq_avx(local_778,ZEXT416(0x3e));
  auVar1._8_8_ = uStack_d70;
  auVar1._0_8_ = local_d78;
  local_798 = vpsrldq_avx(auVar1,8);
  local_79c = 0x3e;
  auVar1 = vpsllq_avx(local_798,ZEXT416(0x3e));
  local_d7c = 2;
  auVar8._8_8_ = uStack_d70;
  auVar8._0_8_ = local_d78;
  local_a78 = vpsrlq_avx(auVar8,ZEXT416(2));
  local_1248 = auVar1._0_8_;
  uStack_1240 = auVar1._8_8_;
  local_a88 = local_1248;
  uStack_a80 = uStack_1240;
  auVar1 = vpor_avx(local_a78,auVar1);
  auVar27._8_8_ = uStack_d90;
  auVar27._0_8_ = local_d98;
  local_7b8 = vpsrldq_avx(auVar27,8);
  local_7bc = 0x3e;
  auVar27 = vpsllq_avx(local_7b8,ZEXT416(0x3e));
  local_d9c = 2;
  auVar7._8_8_ = uStack_d90;
  auVar7._0_8_ = local_d98;
  local_a98 = vpsrlq_avx(auVar7,ZEXT416(2));
  local_1248 = auVar27._0_8_;
  uStack_1240 = auVar27._8_8_;
  local_aa8 = local_1248;
  uStack_aa0 = uStack_1240;
  vpor_avx(local_a98,auVar27);
  local_1228._0_8_ = auVar1._0_8_;
  local_1228._8_8_ = auVar1._8_8_;
  local_1238 = auVar2._0_8_;
  uStack_1230 = auVar2._8_8_;
  local_ab8 = local_1228._0_8_;
  uStack_ab0 = local_1228._8_8_;
  local_ac8 = local_1238;
  uStack_ac0 = uStack_1230;
  local_1228 = vpor_avx(auVar1,auVar2);
  auVar26._8_8_ = uStack_dd0;
  auVar26._0_8_ = local_dd8;
  local_7d8 = vpslldq_avx(auVar26,8);
  local_7dc = 0x3f;
  auVar2 = vpsllq_avx(local_7d8,ZEXT416(0x3f));
  auVar3._8_8_ = uStack_db0;
  auVar3._0_8_ = local_db8;
  local_7f8 = vpsrldq_avx(auVar3,8);
  local_7fc = 0x3f;
  auVar1 = vpsllq_avx(local_7f8,ZEXT416(0x3f));
  local_dbc = 1;
  auVar6._8_8_ = uStack_db0;
  auVar6._0_8_ = local_db8;
  local_ad8 = vpsrlq_avx(auVar6,ZEXT416(1));
  local_1268 = auVar1._0_8_;
  uStack_1260 = auVar1._8_8_;
  local_ae8 = local_1268;
  uStack_ae0 = uStack_1260;
  auVar1 = vpor_avx(local_ad8,auVar1);
  auVar4._8_8_ = uStack_dd0;
  auVar4._0_8_ = local_dd8;
  local_818 = vpsrldq_avx(auVar4,8);
  local_81c = 0x3f;
  auVar27 = vpsllq_avx(local_818,ZEXT416(0x3f));
  local_ddc = 1;
  auVar5._8_8_ = uStack_dd0;
  auVar5._0_8_ = local_dd8;
  local_af8 = vpsrlq_avx(auVar5,ZEXT416(1));
  local_1268 = auVar27._0_8_;
  uStack_1260 = auVar27._8_8_;
  local_b08 = local_1268;
  uStack_b00 = uStack_1260;
  vpor_avx(local_af8,auVar27);
  local_1208._0_8_ = auVar1._0_8_;
  local_1208._8_8_ = auVar1._8_8_;
  local_1258 = auVar2._0_8_;
  uStack_1250 = auVar2._8_8_;
  local_b18 = local_1208._0_8_;
  uStack_b10 = local_1208._8_8_;
  local_b28 = local_1258;
  uStack_b20 = uStack_1250;
  auVar1 = vpor_avx(auVar1,auVar2);
  local_5c8 = local_1228;
  local_5d0 = local_1228;
  local_5d8 = local_1208;
  local_198 = local_1228._0_8_;
  uStack_190 = local_1228._8_8_;
  local_1208._0_8_ = auVar1._0_8_;
  local_1a8 = local_1208._0_8_;
  local_1208._8_8_ = auVar1._8_8_;
  uStack_1a0 = local_1208._8_8_;
  uVar25 = local_1228._8_8_ ^ local_1208._8_8_;
  local_1228._0_8_ = local_1228._0_8_ ^ local_1208._0_8_;
  local_1228._8_8_ = uVar25;
  local_1b8 = local_1218._0_8_;
  uStack_1b0 = local_1218._8_8_;
  local_1c8 = local_11f8._0_8_;
  uStack_1c0 = local_11f8._8_8_;
  local_178 = local_1218._0_8_ ^ local_11f8._0_8_;
  uStack_170 = local_1218._8_8_ ^ local_11f8._8_8_;
  local_5e0 = &local_1028;
  local_5e8 = local_1228;
  local_5f0 = &local_1188;
  local_1228._0_8_ = SUB168(local_1228,0);
  local_158 = local_1228._0_8_;
  local_1228._8_8_ = SUB168(local_1228,8);
  uStack_150 = local_1228._8_8_;
  local_98 = local_1228._0_8_ ^ local_168;
  uStack_90 = local_1228._8_8_ ^ uStack_160;
  local_b8 = local_178 ^ local_188;
  uStack_b0 = uStack_170 ^ uStack_180;
  local_ef8 = local_11e8;
  local_f00 = local_1048;
  local_f08 = local_1068;
  local_398 = local_1048._0_8_;
  uStack_390 = local_1048._8_8_;
  local_3a8 = local_1068._0_8_;
  uStack_3a0 = local_1068._8_8_;
  local_11e8 = vpand_avx(local_1048,local_1068);
  local_3b8 = local_1038._0_8_;
  uStack_3b0 = local_1038._8_8_;
  local_3c8 = local_1058._0_8_;
  uStack_3c0 = local_1058._8_8_;
  local_11d8 = vpand_avx(local_1038,local_1058);
  local_f10 = local_1208;
  local_f18 = local_1068;
  local_f20 = local_1088;
  local_358 = local_1068._0_8_;
  uStack_350 = local_1068._8_8_;
  local_368 = local_1088._0_8_;
  uStack_360 = local_1088._8_8_;
  auVar1 = vpand_avx(local_1068,local_1088);
  local_378 = local_1058._0_8_;
  uStack_370 = local_1058._8_8_;
  local_388 = local_1078._0_8_;
  uStack_380 = local_1078._8_8_;
  auVar2 = vpand_avx(local_1058,local_1078);
  local_f28 = local_1228;
  local_f30 = local_1088;
  local_f38 = local_1048;
  local_318 = local_1088._0_8_;
  uStack_310 = local_1088._8_8_;
  local_328 = local_1048._0_8_;
  uStack_320 = local_1048._8_8_;
  auVar27 = vpand_avx(local_1088,local_1048);
  local_338 = local_1078._0_8_;
  uStack_330 = local_1078._8_8_;
  local_348 = local_1038._0_8_;
  uStack_340 = local_1038._8_8_;
  auVar3 = vpand_avx(local_1078,local_1038);
  local_838 = vpslldq_avx(auVar3,8);
  local_83c = 0x3e;
  auVar26 = vpsllq_avx(local_838,ZEXT416(0x3e));
  local_858 = vpsrldq_avx(auVar27,8);
  local_85c = 0x3e;
  auVar4 = vpsllq_avx(local_858,ZEXT416(0x3e));
  local_1228._0_8_ = auVar27._0_8_;
  local_1228._8_8_ = auVar27._8_8_;
  local_df8 = local_1228._0_8_;
  uStack_df0 = local_1228._8_8_;
  local_dfc = 2;
  local_b38 = vpsrlq_avx(auVar27,ZEXT416(2));
  local_1288 = auVar4._0_8_;
  uStack_1280 = auVar4._8_8_;
  local_b48 = local_1288;
  uStack_b40 = uStack_1280;
  auVar27 = vpor_avx(local_b38,auVar4);
  local_878 = vpsrldq_avx(auVar3,8);
  local_87c = 0x3e;
  auVar4 = vpsllq_avx(local_878,ZEXT416(0x3e));
  local_1218._0_8_ = auVar3._0_8_;
  local_1218._8_8_ = auVar3._8_8_;
  local_e18 = local_1218._0_8_;
  uStack_e10 = local_1218._8_8_;
  local_e1c = 2;
  local_b58 = vpsrlq_avx(auVar3,ZEXT416(2));
  local_1288 = auVar4._0_8_;
  uStack_1280 = auVar4._8_8_;
  local_b68 = local_1288;
  uStack_b60 = uStack_1280;
  auVar3 = vpor_avx(local_b58,auVar4);
  local_1228._0_8_ = auVar27._0_8_;
  local_1228._8_8_ = auVar27._8_8_;
  local_1278 = auVar26._0_8_;
  uStack_1270 = auVar26._8_8_;
  local_b78 = local_1228._0_8_;
  uStack_b70 = local_1228._8_8_;
  local_b88 = local_1278;
  uStack_b80 = uStack_1270;
  local_1228 = vpor_avx(auVar27,auVar26);
  local_898 = vpslldq_avx(auVar2,8);
  local_89c = 0x3f;
  auVar27 = vpsllq_avx(local_898,ZEXT416(0x3f));
  local_8b8 = vpsrldq_avx(auVar1,8);
  local_8bc = 0x3f;
  auVar26 = vpsllq_avx(local_8b8,ZEXT416(0x3f));
  local_1208._0_8_ = auVar1._0_8_;
  local_1208._8_8_ = auVar1._8_8_;
  local_e38 = local_1208._0_8_;
  uStack_e30 = local_1208._8_8_;
  local_e3c = 1;
  local_b98 = vpsrlq_avx(auVar1,ZEXT416(1));
  local_ba8 = auVar26._0_8_;
  uStack_ba0 = auVar26._8_8_;
  auVar1 = vpor_avx(local_b98,auVar26);
  local_8d8 = vpsrldq_avx(auVar2,8);
  local_8dc = 0x3f;
  auVar26 = vpsllq_avx(local_8d8,ZEXT416(0x3f));
  local_11f8._0_8_ = auVar2._0_8_;
  local_11f8._8_8_ = auVar2._8_8_;
  local_e58 = local_11f8._0_8_;
  uStack_e50 = local_11f8._8_8_;
  local_e5c = 1;
  local_bb8 = vpsrlq_avx(auVar2,ZEXT416(1));
  local_bc8 = auVar26._0_8_;
  sStack_bc0 = auVar26._8_8_;
  auVar2 = vpor_avx(local_bb8,auVar26);
  local_1208._0_8_ = auVar1._0_8_;
  local_1208._8_8_ = auVar1._8_8_;
  local_be8 = auVar27._0_8_;
  pbStack_be0 = auVar27._8_8_;
  local_bd8 = local_1208._0_8_;
  uStack_bd0 = local_1208._8_8_;
  local_1208 = vpor_avx(auVar1,auVar27);
  local_5f8 = local_1228;
  local_600 = local_1228;
  local_608 = local_1208;
  local_118 = local_1228._0_8_;
  uStack_110 = local_1228._8_8_;
  local_128 = local_1208._0_8_;
  uStack_120 = local_1208._8_8_;
  uVar25 = local_1228._8_8_ ^ local_1208._8_8_;
  local_1228._0_8_ = local_1228._0_8_ ^ local_1208._0_8_;
  local_1228._8_8_ = uVar25;
  local_138 = local_1218._0_8_;
  uStack_130 = local_1218._8_8_;
  local_148 = local_11f8._0_8_;
  uStack_140 = local_11f8._8_8_;
  local_f8 = local_1218._0_8_ ^ local_11f8._0_8_;
  uStack_f0 = local_1218._8_8_ ^ local_11f8._8_8_;
  local_1218 = auVar3;
  local_1218._0_8_ = local_f8;
  local_1218._8_8_ = uStack_f0;
  local_610 = local_1228;
  local_618 = local_1228;
  local_620 = local_11e8;
  local_d8 = local_1228._0_8_;
  uStack_d0 = local_1228._8_8_;
  local_e8 = local_11e8._0_8_;
  uStack_e0 = local_11e8._8_8_;
  uVar25 = local_1228._8_8_ ^ local_11e8._8_8_;
  local_1228._0_8_ = local_1228._0_8_ ^ local_11e8._0_8_;
  local_1228._8_8_ = uVar25;
  local_108 = local_11d8._0_8_;
  uStack_100 = local_11d8._8_8_;
  local_c8 = local_f8 ^ local_11d8._0_8_;
  uStack_c0 = uStack_f0 ^ local_11d8._8_8_;
  local_1218._0_8_ = local_c8;
  local_1218._8_8_ = uStack_c0;
  local_628 = &local_1028;
  local_630 = &local_1028;
  local_638 = local_1228;
  local_a8 = local_1228._0_8_;
  uStack_a0 = local_1228._8_8_;
  local_1028 = local_98 ^ local_1228._0_8_;
  uStack_1020 = uStack_90 ^ local_1228._8_8_;
  local_1018 = local_b8 ^ local_c8;
  uStack_1010 = uStack_b0 ^ uStack_c0;
  uVar25 = (ulong)*(uint *)(in_RDX + 0x90);
  local_11f8 = auVar2;
  local_fb8 = 0x4924924924924924;
  wStack_fb0 = 0x2492492492492492;
  local_fa0 = in_RDX;
  local_4e8 = local_528;
  uStack_4e0 = uStack_520;
  local_4a8 = local_528;
  uStack_4a0 = uStack_520;
  local_428 = local_468;
  uStack_420 = uStack_460;
  local_408 = local_448;
  uStack_400 = uStack_440;
  local_3e8 = local_468;
  uStack_3e0 = uStack_460;
  local_238 = local_2c8;
  uStack_230 = uStack_2c0;
  local_218 = local_2a8;
  uStack_210 = uStack_2a0;
  local_1188 = local_168;
  uStack_1180 = uStack_160;
  local_1178 = local_188;
  uStack_1170 = uStack_180;
  w128_from_bitstream(pbStack_be0,local_be8,sStack_bc0,local_bc8);
  local_640 = &local_1028;
  local_648 = &local_1028;
  local_650 = local_11e8;
  local_58 = local_1028;
  uStack_50 = uStack_1020;
  local_68 = local_11e8._0_8_;
  uStack_60 = local_11e8._8_8_;
  local_1028 = local_1028 ^ local_11e8._0_8_;
  uStack_1020 = uStack_1020 ^ local_11e8._8_8_;
  local_78 = local_1018;
  uStack_70 = uStack_1010;
  local_88 = local_11d8._0_8_;
  uStack_80 = local_11d8._8_8_;
  local_1018 = local_1018 ^ local_11d8._0_8_;
  uStack_1010 = uStack_1010 ^ local_11d8._8_8_;
  bs = auVar27._0_8_;
  w128_from_bitstream(auVar27._8_8_,(word128 *)bs,auVar26._8_8_,auVar26._0_8_);
  local_658 = &local_1028;
  local_660 = &local_1028;
  local_668 = local_1208;
  local_18 = local_1028;
  uStack_10 = uStack_1020;
  local_28 = local_1208._0_8_;
  uStack_20 = local_1208._8_8_;
  local_1028 = local_1028 ^ local_1208._0_8_;
  uStack_1020 = uStack_1020 ^ local_1208._8_8_;
  local_38 = local_1018;
  uStack_30 = uStack_1010;
  local_48 = local_11f8._0_8_;
  uStack_40 = local_11f8._8_8_;
  local_1018 = local_1018 ^ local_11f8._0_8_;
  uStack_1010 = uStack_1010 ^ local_11f8._8_8_;
  w128_to_bitstream(bs,auVar26._8_8_,auVar26._0_8_,uVar25);
  w128_to_bitstream(bs,auVar26._8_8_,auVar26._0_8_,uVar25);
  *(int *)(local_fa0 + 0x94) = *(int *)(local_fa0 + 0x94) + 0xff;
  return;
}

Assistant:

ATTR_TARGET_S128
static void sbox_aux_s128_lowmc_255_255_4(mzd_local_t* statein, mzd_local_t* stateout,
                                          randomTape_t* tapes) {
  picnic3_aux_sbox_bitsliced_mm128(LOWMC_255_255_4_N, mm128_xor_256, mm128_and_256,
                                   mm128_shift_left_256, mm128_shift_right_256, mask_255_255_85_a,
                                   mask_255_255_85_b, mask_255_255_85_c);
}